

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

Vector<int,_4> __thiscall
deqp::gles3::Functional::swizzleVec<int>(Functional *this,Vector<int,_4> *vec,int swzNdx)

{
  int b;
  int c;
  int d;
  Vector<int,_4> *this_00;
  int *piVar1;
  Vector<int,_4> VVar2;
  IVec4 *swz;
  int swzNdx_local;
  Vector<int,_4> *vec_local;
  
  this_00 = (Vector<int,_4> *)(s_swizzles + (long)(swzNdx % 8) * 0x10);
  piVar1 = tcu::Vector<int,_4>::operator[](this_00,0);
  b = *piVar1;
  piVar1 = tcu::Vector<int,_4>::operator[](this_00,1);
  c = *piVar1;
  piVar1 = tcu::Vector<int,_4>::operator[](this_00,2);
  d = *piVar1;
  tcu::Vector<int,_4>::operator[](this_00,3);
  VVar2 = tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)this,(int)vec,b,c,d);
  VVar2.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar2.m_data;
}

Assistant:

inline tcu::Vector<T, 4> swizzleVec (const tcu::Vector<T, 4>& vec, int swzNdx)
{
	const IVec4& swz = s_swizzles[swzNdx % DE_LENGTH_OF_ARRAY(s_swizzles)];
	return vec.swizzle(swz[0], swz[1], swz[2], swz[3]);
}